

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall
TArray<FLevelStatistics,_FLevelStatistics>::Reserve
          (TArray<FLevelStatistics,_FLevelStatistics> *this,uint amount)

{
  uint uVar1;
  uint local_1c;
  uint i;
  uint place;
  uint amount_local;
  TArray<FLevelStatistics,_FLevelStatistics> *this_local;
  
  Grow(this,amount);
  uVar1 = this->Count;
  this->Count = amount + this->Count;
  for (local_1c = uVar1; local_1c < this->Count; local_1c = local_1c + 1) {
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}